

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O3

uint64_t conBytesLL(char *inArry,int start,int cnt)

{
  ulong uVar1;
  long lVar2;
  byte *pbVar3;
  
  if (0 < cnt) {
    pbVar3 = (byte *)(inArry + start);
    lVar2 = (ulong)(uint)cnt * 8 + -8;
    uVar1 = 0;
    do {
      uVar1 = uVar1 | (ulong)*pbVar3 << ((byte)lVar2 & 0x3f);
      pbVar3 = pbVar3 + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != -8);
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t conBytesLL(char inArry[], int start, int cnt)
{
  unsigned long long outVal = 0;

  for (int i = 0; i < cnt; i++) {
    outVal = ((unsigned long long)(unsigned char)inArry[start + i]
              << ((cnt - i - 1) * 8)) |
             outVal;
  }

  return outVal;
}